

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

string_t duckdb::StringCast::Operation<duckdb::dtime_t>(dtime_t input,Vector *vector)

{
  Vector *vector_00;
  idx_t len;
  char *data;
  int32_t time [4];
  string_t result;
  char micro_buffer [10];
  int32_t iStack_58;
  int32_t local_54;
  int32_t local_50;
  int32_t local_4c [3];
  anon_union_16_2_67f50693_for_value local_40;
  char local_30 [16];
  
  Time::Convert(input,&iStack_58,&local_54,&local_50,local_4c);
  local_30[8] = '\0';
  local_30[9] = '\0';
  local_30[0] = '\0';
  local_30[1] = '\0';
  local_30[2] = '\0';
  local_30[3] = '\0';
  local_30[4] = '\0';
  local_30[5] = '\0';
  local_30[6] = '\0';
  local_30[7] = '\0';
  vector_00 = (Vector *)TimeToStringCast::MicrosLength(local_4c[0],local_30);
  local_40.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString((StringVector *)vector,vector_00,len);
  data = local_40.pointer.prefix;
  if (0xc < local_40._0_4_) {
    data = local_40._8_8_;
  }
  TimeToStringCast::Format(data,(idx_t)vector_00,&iStack_58,local_30);
  string_t::Finalize((string_t *)&local_40.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_40.pointer;
}

Assistant:

duckdb::string_t StringCast::Operation(dtime_t input, Vector &vector) {
	int32_t time[4];
	Time::Convert(input, time[0], time[1], time[2], time[3]);

	char micro_buffer[10] = {};
	idx_t length = TimeToStringCast::Length(time, micro_buffer);

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	TimeToStringCast::Format(data, length, time, micro_buffer);

	result.Finalize();
	return result;
}